

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  uint64_t uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  undefined1 *puVar7;
  byte bVar8;
  bool bVar9;
  uint uVar10;
  undefined1 *puVar11;
  secp256k1_gej *psVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *extraout_RDX_02;
  long lVar17;
  long lVar18;
  code *extraout_RDX_03;
  secp256k1_modinv64_modinfo *psVar19;
  secp256k1_gej *psVar20;
  ulong uVar21;
  ulong uVar22;
  secp256k1_gej *ng;
  secp256k1_gej *r_00;
  uint64_t *puVar23;
  long lVar24;
  secp256k1_gej *psVar25;
  secp256k1_gej *psVar26;
  secp256k1_gej *psVar27;
  secp256k1_gej *psVar28;
  secp256k1_gej *psVar29;
  secp256k1_gej *psVar30;
  secp256k1_gej *psVar31;
  secp256k1_gej *psVar32;
  secp256k1_gej *psVar33;
  secp256k1_fe s1;
  secp256k1_fe h3;
  secp256k1_fe u2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe az;
  secp256k1_fe u1;
  secp256k1_fe s2;
  secp256k1_fe z12;
  secp256k1_scalar sStack_cfc;
  secp256k1_strauss_state sStack_cf8;
  secp256k1_gej sStack_ce0;
  secp256k1_gej sStack_c48;
  secp256k1_fe asStack_bb0 [4];
  secp256k1_ge sStack_ae8;
  secp256k1_ge asStack_a80 [4];
  secp256k1_strauss_point_state sStack_8e0;
  secp256k1_gej *psStack_4c8;
  secp256k1_gej *psStack_4c0;
  secp256k1_gej *psStack_4b8;
  secp256k1_gej *psStack_4b0;
  secp256k1_gej *psStack_4a8;
  secp256k1_gej *psStack_4a0;
  int iStack_494;
  secp256k1_gej *psStack_490;
  uint64_t uStack_488;
  uint64_t uStack_480;
  uint64_t uStack_478;
  secp256k1_gej *psStack_470;
  secp256k1_gej *psStack_468;
  secp256k1_gej *psStack_460;
  secp256k1_gej *psStack_458;
  secp256k1_gej *psStack_450;
  secp256k1_gej *psStack_448;
  uint uStack_434;
  secp256k1_gej *psStack_430;
  secp256k1_gej *psStack_428;
  long lStack_420;
  ulong uStack_418;
  ulong uStack_410;
  secp256k1_gej *psStack_408;
  undefined1 auStack_400 [56];
  uint64_t uStack_3c8;
  uint64_t uStack_3c0;
  uint64_t uStack_3b8;
  ulong auStack_3b0 [2];
  undefined1 auStack_3a0 [56];
  secp256k1_gej *psStack_368;
  secp256k1_gej *psStack_360;
  secp256k1_gej *psStack_358;
  undefined1 auStack_350 [48];
  uint64_t uStack_320;
  uint64_t uStack_318;
  uint64_t uStack_310;
  uint64_t uStack_308;
  undefined1 auStack_300 [96];
  secp256k1_gej *psStack_2a0;
  ulong local_298;
  secp256k1_gej *local_290;
  secp256k1_gej *local_288;
  secp256k1_gej *local_280;
  secp256k1_gej *local_278;
  secp256k1_gej *local_270;
  secp256k1_gej *local_268;
  secp256k1_gej *local_260;
  secp256k1_fe *local_258;
  secp256k1_gej *local_250;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  uint64_t local_1f8;
  int local_1f0;
  undefined1 local_1e8 [56];
  secp256k1_gej *local_1b0;
  secp256k1_gej *local_1a8;
  secp256k1_gej *local_1a0;
  secp256k1_gej *local_198;
  ulong local_190;
  undefined1 local_188 [56];
  secp256k1_gej *local_150;
  secp256k1_gej *local_148;
  secp256k1_gej *local_140;
  ulong local_138;
  ulong local_130;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  ulong local_40;
  
  psStack_2a0 = (secp256k1_gej *)0x11d881;
  secp256k1_gej_verify(a);
  psStack_2a0 = (secp256k1_gej *)0x11d889;
  secp256k1_ge_verify(b);
  psStack_2a0 = (secp256k1_gej *)0x11d891;
  secp256k1_fe_verify(bzinv);
  if (a->infinity != 0) {
    r->infinity = b->infinity;
    psStack_2a0 = (secp256k1_gej *)0x11d8bd;
    secp256k1_fe_sqr(&local_128,bzinv);
    psStack_2a0 = (secp256k1_gej *)0x11d8d3;
    secp256k1_fe_mul(&local_98,&local_128,bzinv);
    psStack_2a0 = (secp256k1_gej *)0x11d8e1;
    secp256k1_fe_mul(&r->x,&b->x,&local_128);
    psStack_2a0 = (secp256k1_gej *)0x11d8f4;
    secp256k1_fe_mul(&r->y,&b->y,&local_98);
    psVar29 = (secp256k1_gej *)&r->z;
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).magnitude = 1;
    (r->z).normalized = 1;
LAB_0011d91f:
    psStack_2a0 = (secp256k1_gej *)0x11d924;
    secp256k1_fe_verify(&psVar29->x);
    psStack_2a0 = (secp256k1_gej *)0x11d92c;
    secp256k1_gej_verify(r);
    return;
  }
  if (b->infinity != 0) {
    memcpy(r,a,0x98);
    return;
  }
  local_258 = &a->z;
  psStack_2a0 = (secp256k1_gej *)0x11d983;
  secp256k1_fe_mul(&local_128,local_258,bzinv);
  psStack_2a0 = (secp256k1_gej *)0x11d996;
  secp256k1_fe_sqr(&local_98,&local_128);
  local_f8.n[0] = (a->x).n[0];
  local_f8.n[1] = (a->x).n[1];
  local_f8.n[2] = (a->x).n[2];
  local_f8.n[3] = (a->x).n[3];
  local_f8.n[4] = (a->x).n[4];
  local_f8.magnitude = (a->x).magnitude;
  local_f8.normalized = (a->x).normalized;
  psStack_2a0 = (secp256k1_gej *)0x11d9cb;
  secp256k1_fe_mul((secp256k1_fe *)local_1e8,&b->x,&local_98);
  local_248._0_8_ = (a->y).n[0];
  local_248._8_8_ = (a->y).n[1];
  local_248._16_8_ = (a->y).n[2];
  local_248._24_8_ = (a->y).n[3];
  local_248._32_8_ = (a->y).n[4];
  local_248._40_4_ = (a->y).magnitude;
  local_248._44_4_ = (a->y).normalized;
  psStack_2a0 = (secp256k1_gej *)0x11da0c;
  local_290 = a;
  secp256k1_fe_mul(&local_c8,&b->y,&local_98);
  psStack_2a0 = (secp256k1_gej *)0x11da1f;
  secp256k1_fe_mul(&local_c8,&local_c8,&local_128);
  psStack_2a0 = (secp256k1_gej *)0x11da27;
  secp256k1_fe_verify(&local_f8);
  psVar20 = (secp256k1_gej *)0x4;
  psStack_2a0 = (secp256k1_gej *)0x11da34;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_f8._40_8_ & 0xffffffff),4);
  psVar29 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - local_f8.n[0]);
  psVar28 = (secp256k1_gej *)(0x9ffffffffffff6 - local_f8.n[1]);
  psVar19 = (secp256k1_modinv64_modinfo *)(0x9ffffffffffff6 - local_f8.n[2]);
  psVar27 = (secp256k1_gej *)(0x9ffffffffffff6 - local_f8.n[3]);
  local_298 = 0x9fffffffffff6 - local_f8.n[4];
  local_130 = 5;
  psStack_2a0 = (secp256k1_gej *)0x11daa1;
  local_188._48_8_ = psVar29;
  local_150 = psVar28;
  local_148 = (secp256k1_gej *)psVar19;
  local_140 = psVar27;
  local_138 = local_298;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
  psStack_2a0 = (secp256k1_gej *)0x11daa9;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
  psVar31 = (secp256k1_gej *)local_1e8;
  psStack_2a0 = (secp256k1_gej *)0x11dab9;
  psVar30 = psVar31;
  secp256k1_fe_verify((secp256k1_fe *)psVar31);
  if ((int)local_1e8._40_4_ < 0x1c) {
    local_250 = (secp256k1_gej *)((long)(psVar29->x).n + local_1e8._0_8_);
    local_260 = (secp256k1_gej *)((long)(psVar28->x).n + local_1e8._8_8_);
    local_270 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar19)->x).n + local_1e8._16_8_);
    local_268 = (secp256k1_gej *)((long)(psVar27->x).n + local_1e8._24_8_);
    local_298 = local_298 + local_1e8._32_8_;
    local_130 = (ulong)(local_1e8._40_4_ + 5);
    psStack_2a0 = (secp256k1_gej *)0x11db37;
    local_188._48_8_ = local_250;
    local_150 = local_260;
    local_148 = local_270;
    local_140 = local_268;
    local_138 = local_298;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    psStack_2a0 = (secp256k1_gej *)0x11db47;
    secp256k1_fe_verify(&local_c8);
    psVar20 = (secp256k1_gej *)0x1;
    psStack_2a0 = (secp256k1_gej *)0x11db55;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)local_c8.magnitude,1);
    psVar27 = (secp256k1_gej *)(0x3ffffbfffff0bc - local_c8.n[0]);
    psVar19 = (secp256k1_modinv64_modinfo *)(0x3ffffffffffffc - local_c8.n[1]);
    psVar28 = (secp256k1_gej *)(0x3ffffffffffffc - local_c8.n[2]);
    psVar31 = (secp256k1_gej *)(0x3ffffffffffffc - local_c8.n[3]);
    psVar29 = (secp256k1_gej *)(0x3fffffffffffc - local_c8.n[4]);
    local_190 = 2;
    psStack_2a0 = (secp256k1_gej *)0x11dbb7;
    local_1e8._48_8_ = psVar27;
    local_1b0 = (secp256k1_gej *)psVar19;
    local_1a8 = psVar28;
    local_1a0 = psVar31;
    local_198 = psVar29;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    psStack_2a0 = (secp256k1_gej *)0x11dbc4;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    psVar30 = (secp256k1_gej *)local_248;
    psStack_2a0 = (secp256k1_gej *)0x11dbce;
    secp256k1_fe_verify((secp256k1_fe *)psVar30);
    if (0x1e < (int)local_248._40_4_) goto LAB_0011e0cd;
    local_280 = (secp256k1_gej *)((long)(psVar27->x).n + local_248._0_8_);
    local_278 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar19)->x).n + local_248._8_8_);
    local_288 = (secp256k1_gej *)((long)(psVar28->x).n + local_248._16_8_);
    psVar28 = (secp256k1_gej *)((long)(psVar31->x).n + local_248._24_8_);
    psVar19 = (secp256k1_modinv64_modinfo *)((long)(psVar29->x).n + local_248._32_8_);
    local_190 = (ulong)(local_248._40_4_ + 2);
    psStack_2a0 = (secp256k1_gej *)0x11dc37;
    local_1e8._48_8_ = local_280;
    local_1b0 = local_278;
    local_1a8 = local_288;
    local_1a0 = psVar28;
    local_198 = (secp256k1_gej *)psVar19;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    psStack_2a0 = (secp256k1_gej *)0x11dc44;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    puVar7 = (undefined1 *)((local_298 >> 0x30) * 0x1000003d1 + (long)local_250);
    if ((((ulong)puVar7 & 0xfffffffffffff) == 0xffffefffffc2f) ||
       (((ulong)puVar7 & 0xfffffffffffff) == 0)) {
      uVar14 = (long)(local_260->x).n + ((ulong)puVar7 >> 0x34);
      puVar11 = (undefined1 *)((long)(local_270->x).n + (uVar14 >> 0x34));
      uVar16 = (long)(local_268->x).n + ((ulong)puVar11 >> 0x34);
      uVar21 = (uVar16 >> 0x34) + (local_298 & 0xffffffffffff);
      if ((((uVar14 | (ulong)puVar7 | (ulong)puVar11 | uVar16) & 0xfffffffffffff) == 0 &&
           uVar21 == 0) ||
         ((((ulong)puVar7 | 0x1000003d0) & uVar14 & (ulong)puVar11 & uVar16 &
          (uVar21 ^ 0xf000000000000)) == 0xfffffffffffff)) {
        psStack_2a0 = (secp256k1_gej *)0x11e009;
        secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
        uVar16 = ((ulong)psVar19 >> 0x30) * 0x1000003d1 + (long)local_280;
        if (((uVar16 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar16 & 0xfffffffffffff) == 0)) {
          puVar7 = (undefined1 *)((long)(local_278->x).n + (uVar16 >> 0x34));
          uVar21 = (long)(local_288->x).n + ((ulong)puVar7 >> 0x34);
          uVar14 = (long)(psVar28->x).n + (uVar21 >> 0x34);
          uVar15 = (uVar14 >> 0x34) + ((ulong)psVar19 & 0xffffffffffff);
          if (((((ulong)puVar7 | uVar16 | uVar21 | uVar14) & 0xfffffffffffff) == 0 && uVar15 == 0)
             || (((uVar16 | 0x1000003d0) & (ulong)puVar7 & uVar21 & uVar14 &
                 (uVar15 ^ 0xf000000000000)) == 0xfffffffffffff)) {
            psStack_2a0 = (secp256k1_gej *)0x11e0c3;
            secp256k1_gej_double_var(r,local_290,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_2a0 = (secp256k1_gej *)0x11e0af;
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    psVar31 = (secp256k1_gej *)(local_188 + 0x30);
    psStack_2a0 = (secp256k1_gej *)0x11dd2b;
    secp256k1_fe_mul(&r->z,local_258,(secp256k1_fe *)psVar31);
    psVar29 = (secp256k1_gej *)&stack0xffffffffffffff98;
    psStack_2a0 = (secp256k1_gej *)0x11dd3e;
    secp256k1_fe_sqr((secp256k1_fe *)psVar29,(secp256k1_fe *)psVar31);
    psStack_2a0 = (secp256k1_gej *)0x11dd46;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    psStack_2a0 = (secp256k1_gej *)0x11dd54;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_40 & 0xffffffff),1);
    local_68 = 0x3ffffbfffff0bc - local_68;
    uStack_60 = 0x3ffffffffffffc - uStack_60;
    local_58 = 0x3ffffffffffffc - local_58;
    uStack_50 = 0x3ffffffffffffc - uStack_50;
    local_48 = 0x3fffffffffffc - local_48;
    local_40 = 2;
    psStack_2a0 = (secp256k1_gej *)0x11dd9c;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    psVar27 = (secp256k1_gej *)(local_248 + 0x30);
    psStack_2a0 = (secp256k1_gej *)0x11ddb2;
    secp256k1_fe_mul((secp256k1_fe *)psVar27,(secp256k1_fe *)psVar29,(secp256k1_fe *)psVar31);
    psStack_2a0 = (secp256k1_gej *)0x11ddca;
    secp256k1_fe_mul((secp256k1_fe *)local_188,&local_f8,(secp256k1_fe *)psVar29);
    psVar20 = (secp256k1_gej *)(local_1e8 + 0x30);
    psStack_2a0 = (secp256k1_gej *)0x11ddda;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar20);
    psStack_2a0 = (secp256k1_gej *)0x11dde2;
    secp256k1_fe_verify(&r->x);
    psStack_2a0 = (secp256k1_gej *)0x11ddea;
    psVar30 = psVar27;
    secp256k1_fe_verify((secp256k1_fe *)psVar27);
    iVar6 = local_1f0 + (r->x).magnitude;
    if (0x20 < iVar6) goto LAB_0011e0d2;
    uVar1 = (r->x).n[1];
    uVar4 = (r->x).n[2];
    uVar5 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._48_8_;
    (r->x).n[1] = uVar1 + uStack_210;
    (r->x).n[2] = uVar4 + local_208;
    (r->x).n[3] = uVar5 + uStack_200;
    puVar23 = (r->x).n + 4;
    *puVar23 = *puVar23 + local_1f8;
    (r->x).magnitude = iVar6;
    (r->x).normalized = 0;
    psStack_2a0 = (secp256k1_gej *)0x11de3d;
    secp256k1_fe_verify(&r->x);
    psStack_2a0 = (secp256k1_gej *)0x11de45;
    secp256k1_fe_verify(&r->x);
    psVar29 = (secp256k1_gej *)local_188;
    psStack_2a0 = (secp256k1_gej *)0x11de55;
    psVar30 = psVar29;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    iVar6 = local_188._40_4_ + (r->x).magnitude;
    if (0x20 < iVar6) goto LAB_0011e0d7;
    uVar1 = (r->x).n[1];
    uVar4 = (r->x).n[2];
    uVar5 = (r->x).n[3];
    psVar29 = (secp256k1_gej *)local_188;
    (r->x).n[0] = (r->x).n[0] + local_188._0_8_;
    (r->x).n[1] = uVar1 + local_188._8_8_;
    (r->x).n[2] = uVar4 + local_188._16_8_;
    (r->x).n[3] = uVar5 + local_188._24_8_;
    puVar23 = (r->x).n + 4;
    *puVar23 = *puVar23 + local_188._32_8_;
    (r->x).magnitude = iVar6;
    (r->x).normalized = 0;
    psStack_2a0 = (secp256k1_gej *)0x11dea4;
    secp256k1_fe_verify(&r->x);
    psStack_2a0 = (secp256k1_gej *)0x11deac;
    secp256k1_fe_verify(&r->x);
    psStack_2a0 = (secp256k1_gej *)0x11deb4;
    psVar30 = psVar29;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    iVar6 = local_188._40_4_ + (r->x).magnitude;
    if (0x20 < iVar6) goto LAB_0011e0dc;
    uVar1 = (r->x).n[1];
    uVar4 = (r->x).n[2];
    uVar5 = (r->x).n[3];
    psVar29 = (secp256k1_gej *)local_188;
    (r->x).n[0] = (r->x).n[0] + local_188._0_8_;
    (r->x).n[1] = uVar1 + local_188._8_8_;
    (r->x).n[2] = uVar4 + local_188._16_8_;
    (r->x).n[3] = uVar5 + local_188._24_8_;
    puVar23 = (r->x).n + 4;
    *puVar23 = *puVar23 + local_188._32_8_;
    (r->x).magnitude = iVar6;
    (r->x).normalized = 0;
    psStack_2a0 = (secp256k1_gej *)0x11df03;
    secp256k1_fe_verify(&r->x);
    psStack_2a0 = (secp256k1_gej *)0x11df0b;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    psStack_2a0 = (secp256k1_gej *)0x11df13;
    psVar30 = r;
    secp256k1_fe_verify(&r->x);
    iVar6 = (r->x).magnitude + local_188._40_4_;
    if (0x20 < iVar6) goto LAB_0011e0e1;
    local_188._0_8_ = (r->x).n[0] + local_188._0_8_;
    local_188._8_8_ = (r->x).n[1] + local_188._8_8_;
    local_188._16_8_ = (r->x).n[2] + local_188._16_8_;
    local_188._24_8_ = (r->x).n[3] + local_188._24_8_;
    local_188._32_8_ = local_188._32_8_ + (r->x).n[4];
    local_188._44_4_ = 0;
    psStack_2a0 = (secp256k1_gej *)0x11df66;
    local_188._40_4_ = iVar6;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    psVar29 = (secp256k1_gej *)&r->y;
    psStack_2a0 = (secp256k1_gej *)0x11df7d;
    secp256k1_fe_mul((secp256k1_fe *)psVar29,(secp256k1_fe *)local_188,
                     (secp256k1_fe *)(local_1e8 + 0x30));
    psVar31 = (secp256k1_gej *)(local_248 + 0x30);
    psStack_2a0 = (secp256k1_gej *)0x11df95;
    psVar20 = psVar31;
    secp256k1_fe_mul((secp256k1_fe *)psVar31,(secp256k1_fe *)psVar31,(secp256k1_fe *)local_248);
    psStack_2a0 = (secp256k1_gej *)0x11df9d;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    psStack_2a0 = (secp256k1_gej *)0x11dfa5;
    psVar30 = psVar31;
    secp256k1_fe_verify((secp256k1_fe *)psVar31);
    local_1f0 = local_1f0 + (r->y).magnitude;
    if (local_1f0 < 0x21) {
      uVar1 = (r->y).n[1];
      uVar4 = (r->y).n[2];
      uVar5 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_248._48_8_;
      (r->y).n[1] = uVar1 + uStack_210;
      (r->y).n[2] = uVar4 + local_208;
      (r->y).n[3] = uVar5 + uStack_200;
      puVar23 = (r->y).n + 4;
      *puVar23 = *puVar23 + local_1f8;
      (r->y).magnitude = local_1f0;
      (r->y).normalized = 0;
      goto LAB_0011d91f;
    }
  }
  else {
    psStack_2a0 = (secp256k1_gej *)0x11e0cd;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0011e0cd:
    psStack_2a0 = (secp256k1_gej *)0x11e0d2;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0011e0d2:
    psStack_2a0 = (secp256k1_gej *)0x11e0d7;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0011e0d7:
    psStack_2a0 = (secp256k1_gej *)0x11e0dc;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0011e0dc:
    psStack_2a0 = (secp256k1_gej *)0x11e0e1;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_0011e0e1:
    psStack_2a0 = (secp256k1_gej *)0x11e0e6;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  psStack_2a0 = (secp256k1_gej *)secp256k1_fe_inv_var;
  secp256k1_gej_add_zinv_var_cold_1();
  psVar32 = (secp256k1_gej *)0xf000000000000;
  psStack_448 = (secp256k1_gej *)0x11e134;
  psStack_408 = psVar30;
  auStack_300._56_8_ = r;
  auStack_300._64_8_ = psVar27;
  auStack_300._72_8_ = psVar28;
  auStack_300._80_8_ = psVar29;
  auStack_300._88_8_ = psVar31;
  psStack_2a0 = (secp256k1_gej *)psVar19;
  secp256k1_fe_verify(&psVar20->x);
  uVar16 = (psVar20->x).n[4];
  lStack_420 = 0x1000003d1;
  uVar21 = (uVar16 >> 0x30) * 0x1000003d1 + (psVar20->x).n[0];
  uVar22 = (uVar21 >> 0x34) + (psVar20->x).n[1];
  uVar14 = (uVar22 >> 0x34) + (psVar20->x).n[2];
  uVar15 = (uVar14 >> 0x34) + (psVar20->x).n[3];
  uVar16 = (uVar15 >> 0x34) + (uVar16 & 0xffffffffffff);
  uStack_410 = (uVar22 | uVar21 | uVar14 | uVar15) & 0xfffffffffffff | uVar16;
  uStack_418 = (uVar21 ^ 0x1000003d0) & uVar22 & uVar14 & uVar15 & (uVar16 ^ 0xf000000000000);
  psStack_448 = (secp256k1_gej *)0x11e1ae;
  secp256k1_fe_verify(&psVar20->x);
  auStack_300._0_8_ = (psVar20->x).n[0];
  auStack_300._8_8_ = (psVar20->x).n[1];
  auStack_300._16_8_ = (psVar20->x).n[2];
  auStack_300._24_8_ = (psVar20->x).n[3];
  auStack_300._32_8_ = (psVar20->x).n[4];
  auStack_300._40_4_ = (psVar20->x).magnitude;
  auStack_300._44_4_ = (psVar20->x).normalized;
  psVar29 = (secp256k1_gej *)auStack_300;
  psStack_448 = (secp256k1_gej *)0x11e1dd;
  psStack_428 = psVar20;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar29);
  auStack_400._0_8_ = (auStack_300._8_8_ << 0x34 | auStack_300._0_8_) & 0x3fffffffffffffff;
  auStack_400._8_8_ =
       (ulong)((uint)auStack_300._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_300._8_8_ >> 10;
  auStack_400._16_8_ =
       (ulong)((uint)auStack_300._24_8_ & 0x3fffffff) << 0x20 | (ulong)auStack_300._16_8_ >> 0x14;
  auStack_400._24_8_ =
       (auStack_300._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_300._24_8_ >> 0x1e;
  auStack_400._32_8_ = (ulong)auStack_300._32_8_ >> 0x28;
  auStack_350._16_8_ = 0;
  auStack_350._24_8_ = 0;
  auStack_350._0_8_ = (undefined1 *)0x0;
  auStack_350._8_8_ = 0;
  auStack_350._32_8_ = 0;
  uStack_310 = 0;
  uStack_308 = 0;
  uStack_320 = 0;
  uStack_318 = 0;
  auStack_350._40_8_ = 1;
  uStack_3c0 = 0;
  uStack_3b8 = 0;
  auStack_400._48_8_ = -0x1000003d1;
  uStack_3c8 = 0;
  auStack_3b0[0] = 0x100;
  psStack_430 = (secp256k1_gej *)0x0;
  psVar30 = (secp256k1_gej *)0xffffffffffffffff;
  uStack_434 = 5;
  auStack_3a0._0_8_ = auStack_400._0_8_;
  auStack_3a0._8_8_ = auStack_400._8_8_;
  auStack_3a0._16_8_ = auStack_400._16_8_;
  auStack_3a0._24_8_ = auStack_400._24_8_;
  auStack_3a0._32_8_ = auStack_400._32_8_;
LAB_0011e2f3:
  psVar27 = (secp256k1_gej *)auStack_400._48_8_;
  psVar28 = (secp256k1_gej *)0x0;
  psVar25 = (secp256k1_gej *)0x0;
  psVar20 = (secp256k1_gej *)0x1;
  uVar13 = 0x3e;
  ng = (secp256k1_gej *)0x1;
  puVar7 = (undefined1 *)auStack_3a0._0_8_;
  psVar31 = (secp256k1_gej *)auStack_400._48_8_;
  while( true ) {
    r_00 = (secp256k1_gej *)(-1L << ((byte)uVar13 & 0x3f) | (ulong)puVar7);
    psVar12 = (secp256k1_gej *)0x0;
    if (r_00 != (secp256k1_gej *)0x0) {
      for (; ((ulong)r_00 >> (long)psVar12 & 1) == 0;
          psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1)) {
      }
    }
    bVar8 = (byte)psVar12;
    psVar26 = (secp256k1_gej *)((ulong)puVar7 >> (bVar8 & 0x3f));
    ng = (secp256k1_gej *)((long)ng << (bVar8 & 0x3f));
    psVar28 = (secp256k1_gej *)((long)psVar28 << (bVar8 & 0x3f));
    psVar30 = (secp256k1_gej *)((long)psVar30 - (long)psVar12);
    uVar13 = uVar13 - (int)psVar12;
    if (uVar13 == 0) break;
    if (((ulong)psVar31 & 1) == 0) {
      psStack_448 = (secp256k1_gej *)0x11e867;
      secp256k1_fe_inv_var_cold_8();
LAB_0011e867:
      psStack_448 = (secp256k1_gej *)0x11e86c;
      secp256k1_fe_inv_var_cold_7();
LAB_0011e86c:
      psStack_448 = (secp256k1_gej *)0x11e871;
      secp256k1_fe_inv_var_cold_1();
LAB_0011e871:
      psStack_448 = (secp256k1_gej *)0x11e876;
      secp256k1_fe_inv_var_cold_2();
LAB_0011e876:
      psStack_448 = (secp256k1_gej *)0x11e87b;
      secp256k1_fe_inv_var_cold_6();
      psVar26 = psVar31;
      goto LAB_0011e87b;
    }
    if (((ulong)psVar26 & 1) == 0) goto LAB_0011e867;
    r_00 = (secp256k1_gej *)((long)psVar28 * auStack_3a0._0_8_ + (long)ng * auStack_400._48_8_);
    psVar12 = (secp256k1_gej *)(ulong)(0x3e - uVar13);
    bVar8 = (byte)(0x3e - uVar13);
    psVar29 = (secp256k1_gej *)((long)psVar31 << (bVar8 & 0x3f));
    if (r_00 != psVar29) goto LAB_0011e86c;
    psVar29 = (secp256k1_gej *)
              ((long)psVar20 * auStack_3a0._0_8_ + (long)psVar25 * auStack_400._48_8_);
    r_00 = (secp256k1_gej *)((long)psVar26 << (bVar8 & 0x3f));
    if (psVar29 != r_00) goto LAB_0011e871;
    psVar12 = (secp256k1_gej *)((long)psVar30[-5].x.n + 0xe);
    if (psVar12 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0011e876;
    iVar6 = (int)psVar26;
    if ((long)psVar30 < 0) {
      psVar30 = (secp256k1_gej *)-(long)psVar30;
      uVar10 = (int)psVar30 + 1;
      if ((int)uVar13 <= (int)uVar10) {
        uVar10 = uVar13;
      }
      psVar12 = (secp256k1_gej *)(ulong)uVar10;
      r_00 = (secp256k1_gej *)(ulong)(uVar10 - 0x3f);
      if (0xffffffc1 < uVar10 - 0x3f) {
        psVar33 = (secp256k1_gej *)-(long)psVar28;
        psVar19 = (secp256k1_modinv64_modinfo *)-(long)ng;
        psVar12 = (secp256k1_gej *)-(long)psVar31;
        psVar29 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar10 & 0x3fU)) >> (-(char)uVar10 & 0x3fU));
        uVar10 = (iVar6 * iVar6 + 0x3e) * iVar6 * (int)psVar12 & (uint)psVar29;
        psVar28 = psVar20;
        ng = psVar25;
        psVar32 = psVar33;
        goto LAB_0011e44d;
      }
      goto LAB_0011e885;
    }
    uVar10 = (int)psVar30 + 1;
    if ((int)uVar13 <= (int)uVar10) {
      uVar10 = uVar13;
    }
    psVar12 = (secp256k1_gej *)(ulong)uVar10;
    r_00 = (secp256k1_gej *)(ulong)(uVar10 - 0x3f);
    if (uVar10 - 0x3f < 0xffffffc2) goto LAB_0011e880;
    psVar29 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar10 & 0x3fU)) >> (-(char)uVar10 & 0x3fU))
    ;
    uVar10 = -(iVar6 * (((int)psVar31 * 2 + 2U & 8) + (int)psVar31)) & (uint)psVar29;
    psVar19 = (secp256k1_modinv64_modinfo *)psVar25;
    psVar33 = psVar20;
    psVar12 = psVar26;
    psVar26 = psVar31;
LAB_0011e44d:
    uVar16 = (ulong)uVar10;
    r_00 = (secp256k1_gej *)(uVar16 * (long)psVar26);
    puVar7 = (undefined1 *)((long)(psVar12->x).n + (long)(r_00->x).n);
    psVar25 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar19)->x).n + (long)ng * uVar16);
    psVar12 = (secp256k1_gej *)(uVar16 * (long)psVar28);
    psVar20 = (secp256k1_gej *)((long)(psVar33->x).n + (long)(psVar12->x).n);
    psVar31 = psVar26;
    if (((ulong)puVar7 & (ulong)psVar29) != 0) {
LAB_0011e87b:
      psStack_448 = (secp256k1_gej *)0x11e880;
      secp256k1_fe_inv_var_cold_4();
      psVar31 = psVar26;
LAB_0011e880:
      psStack_448 = (secp256k1_gej *)0x11e885;
      secp256k1_fe_inv_var_cold_3();
LAB_0011e885:
      psStack_448 = (secp256k1_gej *)0x11e88a;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_0011e88a;
    }
  }
  r_00 = (secp256k1_gej *)((long)psVar28 * (long)psVar25);
  psVar12 = SUB168(SEXT816((long)psVar28) * SEXT816((long)psVar25),8);
  psStack_468 = (secp256k1_gej *)auStack_400._48_8_;
  auStack_3a0._48_8_ = ng;
  psStack_368 = psVar28;
  psStack_360 = psVar25;
  psStack_358 = psVar20;
  if ((long)ng * (long)psVar20 - (long)r_00 != 0x4000000000000000 ||
      SUB168(SEXT816((long)ng) * SEXT816((long)psVar20),8) - (long)psVar12 !=
      (ulong)((secp256k1_gej *)((long)ng * (long)psVar20) < r_00)) goto LAB_0011e8c6;
  psStack_448 = (secp256k1_gej *)0x11e4d3;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_350,
             (secp256k1_modinv64_signed62 *)(auStack_350 + 0x28),
             (secp256k1_modinv64_trans2x2 *)(auStack_3a0 + 0x30),
             (secp256k1_modinv64_modinfo *)psVar12);
  uVar13 = uStack_434;
  psVar32 = (secp256k1_gej *)(auStack_400 + 0x30);
  psVar29 = (secp256k1_gej *)(ulong)uStack_434;
  ng = (secp256k1_gej *)(ulong)uStack_434;
  psVar19 = &secp256k1_const_modinfo_fe;
  psVar12 = (secp256k1_gej *)0xffffffffffffffff;
  psStack_448 = (secp256k1_gej *)0x11e4f7;
  r_00 = psVar32;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar32,uStack_434,
                     &secp256k1_const_modinfo_fe.modulus,-1);
  psVar31 = psStack_430;
  psVar27 = (secp256k1_gej *)auStack_3a0;
  if (0 < iVar6) {
    psVar12 = (secp256k1_gej *)0x1;
    ng = (secp256k1_gej *)(ulong)uVar13;
    psStack_448 = (secp256k1_gej *)0x11e51e;
    r_00 = psVar32;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar6) goto LAB_0011e88f;
    ng = (secp256k1_gej *)(ulong)uVar13;
    psVar12 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_448 = (secp256k1_gej *)0x11e53a;
    r_00 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar6 < 1) goto LAB_0011e894;
    psVar12 = (secp256k1_gej *)0x1;
    ng = (secp256k1_gej *)(ulong)uVar13;
    psStack_448 = (secp256k1_gej *)0x11e554;
    r_00 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar6) goto LAB_0011e899;
    psStack_448 = (secp256k1_gej *)0x11e571;
    secp256k1_modinv64_update_fg_62_var
              (uVar13,(secp256k1_modinv64_signed62 *)psVar32,(secp256k1_modinv64_signed62 *)psVar27,
               (secp256k1_modinv64_trans2x2 *)(auStack_3a0 + 0x30));
    if ((undefined1 *)auStack_3a0._0_8_ == (undefined1 *)0x0) {
      if (1 < (int)uVar13) {
        uVar16 = 1;
        uVar21 = 0;
        do {
          uVar21 = uVar21 | *(ulong *)(auStack_3a0 + uVar16 * 8);
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
        if (uVar21 != 0) goto LAB_0011e5a7;
      }
      r_00 = (secp256k1_gej *)auStack_3a0;
      ng = (secp256k1_gej *)(ulong)uVar13;
      psVar12 = (secp256k1_gej *)0x0;
      psStack_448 = (secp256k1_gej *)0x11e69d;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)r_00,uVar13,&SECP256K1_SIGNED62_ONE,0);
      if (iVar6 != 0) goto LAB_0011e8b7;
      psStack_448 = (secp256k1_gej *)0x11e6bf;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)(auStack_400 + 0x30),uVar13,
                         &SECP256K1_SIGNED62_ONE,-1);
      modinfo = extraout_RDX;
      if (iVar6 != 0) {
        psStack_448 = (secp256k1_gej *)0x11e6db;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)(auStack_400 + 0x30),uVar13,
                           &SECP256K1_SIGNED62_ONE,1);
        modinfo = extraout_RDX_00;
        if (iVar6 != 0) {
          r_00 = (secp256k1_gej *)auStack_400;
          ng = (secp256k1_gej *)0x5;
          psVar12 = (secp256k1_gej *)0x0;
          psStack_448 = (secp256k1_gej *)0x11e6f7;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar6 != 0) goto LAB_0011e8c1;
          r_00 = (secp256k1_gej *)auStack_350;
          ng = (secp256k1_gej *)0x5;
          psVar12 = (secp256k1_gej *)0x0;
          psStack_448 = (secp256k1_gej *)0x11e71a;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar6 != 0) goto LAB_0011e8c1;
          r_00 = (secp256k1_gej *)(auStack_400 + 0x30);
          psVar12 = (secp256k1_gej *)0x1;
          ng = (secp256k1_gej *)(ulong)uVar13;
          psStack_448 = (secp256k1_gej *)0x11e73a;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,uVar13,
                             &secp256k1_const_modinfo_fe.modulus,1);
          modinfo = extraout_RDX_01;
          if (iVar6 != 0) goto LAB_0011e8c1;
        }
      }
      psStack_448 = (secp256k1_gej *)0x11e75a;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_350,
                 *(int64_t *)(auStack_400 + (long)(int)uVar13 * 8 + 0x28),modinfo);
      psVar29 = psStack_408;
      auStack_400._32_8_ = auStack_350._32_8_;
      auStack_400._16_8_ = auStack_350._16_8_;
      auStack_400._24_8_ = auStack_350._24_8_;
      auStack_400._0_8_ = auStack_350._0_8_;
      auStack_400._8_8_ = auStack_350._8_8_;
      psStack_448 = (secp256k1_gej *)0x11e782;
      secp256k1_fe_from_signed62(&psStack_408->x,(secp256k1_modinv64_signed62 *)auStack_400);
      (psVar29->x).magnitude = (uint)(0 < (psStack_428->x).magnitude);
      (psVar29->x).normalized = 1;
      psStack_448 = (secp256k1_gej *)0x11e7a2;
      secp256k1_fe_verify(&psVar29->x);
      uVar16 = (psVar29->x).n[4];
      psVar20 = (secp256k1_gej *)(uVar16 & 0xffffffffffff);
      uVar21 = (uVar16 >> 0x30) * lStack_420 + (psVar29->x).n[0];
      uVar16 = (uVar21 >> 0x34) + (psVar29->x).n[1];
      uVar14 = (uVar16 >> 0x34) + (psVar29->x).n[2];
      uVar15 = (uVar14 >> 0x34) + (psVar29->x).n[3];
      ng = (secp256k1_gej *)((long)(psVar20->x).n + (uVar15 >> 0x34));
      r_00 = (secp256k1_gej *)
             ((uVar21 ^ 0x1000003d0) & uVar16 & uVar14 & uVar15 & ((ulong)ng ^ 0xf000000000000));
      bVar9 = r_00 == (secp256k1_gej *)0xfffffffffffff ||
              ((uVar16 | uVar21 | uVar14 | uVar15) & 0xfffffffffffff) == 0 &&
              ng == (secp256k1_gej *)0x0;
      psVar12 = (secp256k1_gej *)CONCAT71((int7)(((ulong)ng ^ 0xf000000000000) >> 8),bVar9);
      if ((uStack_418 != 0xfffffffffffff && uStack_410 != 0) != bVar9) {
        secp256k1_fe_verify(&psVar29->x);
        return;
      }
      goto LAB_0011e8bc;
    }
LAB_0011e5a7:
    lVar18 = (long)(int)uVar13;
    uVar16 = *(ulong *)(auStack_400 + lVar18 * 8 + 0x28);
    psVar12 = (secp256k1_gej *)auStack_3b0[lVar18 + 1];
    r_00 = (secp256k1_gej *)((long)uVar16 >> 0x3f ^ uVar16 | lVar18 + -2 >> 0x3f);
    ng = (secp256k1_gej *)((long)psVar12 >> 0x3f ^ (ulong)psVar12 | (ulong)r_00);
    if (ng == (secp256k1_gej *)0x0) {
      psVar29 = (secp256k1_gej *)(ulong)(uVar13 - 1);
      *(ulong *)(auStack_400 + lVar18 * 8 + 0x20) =
           *(ulong *)(auStack_400 + lVar18 * 8 + 0x20) | uVar16 << 0x3e;
      psVar12 = (secp256k1_gej *)((long)psVar12 << 0x3e);
      auStack_3b0[lVar18] = auStack_3b0[lVar18] | (ulong)psVar12;
    }
    if ((int)psVar31 == 0xb) goto LAB_0011e89e;
    uVar13 = (uint)psVar29;
    psVar19 = &secp256k1_const_modinfo_fe;
    psVar12 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_448 = (secp256k1_gej *)0x11e617;
    ng = psVar29;
    r_00 = psVar32;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar6 < 1) goto LAB_0011e8a3;
    psVar12 = (secp256k1_gej *)0x1;
    psStack_448 = (secp256k1_gej *)0x11e631;
    ng = psVar29;
    r_00 = psVar32;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar6) goto LAB_0011e8a8;
    psVar12 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_448 = (secp256k1_gej *)0x11e64d;
    ng = psVar29;
    r_00 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar6 < 1) goto LAB_0011e8ad;
    psVar12 = (secp256k1_gej *)0x1;
    psStack_448 = (secp256k1_gej *)0x11e667;
    ng = psVar29;
    r_00 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar13,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar6) goto LAB_0011e8b2;
    psStack_430 = (secp256k1_gej *)(ulong)((int)psVar31 + 1);
    uStack_434 = uVar13;
    goto LAB_0011e2f3;
  }
LAB_0011e88a:
  psStack_448 = (secp256k1_gej *)0x11e88f;
  secp256k1_fe_inv_var_cold_21();
LAB_0011e88f:
  psStack_448 = (secp256k1_gej *)0x11e894;
  secp256k1_fe_inv_var_cold_20();
LAB_0011e894:
  psStack_448 = (secp256k1_gej *)0x11e899;
  secp256k1_fe_inv_var_cold_19();
LAB_0011e899:
  psStack_448 = (secp256k1_gej *)0x11e89e;
  secp256k1_fe_inv_var_cold_18();
LAB_0011e89e:
  psStack_448 = (secp256k1_gej *)0x11e8a3;
  secp256k1_fe_inv_var_cold_14();
LAB_0011e8a3:
  psStack_448 = (secp256k1_gej *)0x11e8a8;
  secp256k1_fe_inv_var_cold_13();
LAB_0011e8a8:
  psStack_448 = (secp256k1_gej *)0x11e8ad;
  secp256k1_fe_inv_var_cold_12();
LAB_0011e8ad:
  psStack_448 = (secp256k1_gej *)0x11e8b2;
  secp256k1_fe_inv_var_cold_11();
LAB_0011e8b2:
  psStack_448 = (secp256k1_gej *)0x11e8b7;
  secp256k1_fe_inv_var_cold_10();
LAB_0011e8b7:
  psStack_448 = (secp256k1_gej *)0x11e8bc;
  secp256k1_fe_inv_var_cold_15();
LAB_0011e8bc:
  psStack_448 = (secp256k1_gej *)0x11e8c1;
  secp256k1_fe_inv_var_cold_17();
LAB_0011e8c1:
  psStack_448 = (secp256k1_gej *)0x11e8c6;
  secp256k1_fe_inv_var_cold_16();
  psStack_468 = psVar27;
LAB_0011e8c6:
  psStack_448 = (secp256k1_gej *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar6 = (int)r_00;
  psVar27 = (secp256k1_gej *)psVar19;
  psVar28 = psStack_468;
  psStack_470 = psVar29;
  psStack_460 = psVar31;
  psStack_458 = psVar30;
  psStack_450 = psVar32;
  psStack_448 = (secp256k1_gej *)psVar19;
  if (iVar6 < 1) {
LAB_0011eb73:
    psStack_4a0 = (secp256k1_gej *)0x11eb78;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011eb78:
    psStack_4a0 = (secp256k1_gej *)0x11eb7d;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar26 = psVar30;
LAB_0011eb7d:
    psStack_4a0 = (secp256k1_gej *)0x11eb82;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011eb82:
    psStack_4a0 = (secp256k1_gej *)0x11eb87;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011eb87:
    psStack_4a0 = (secp256k1_gej *)0x11eb8c;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar30 = psVar26;
    psVar25 = psVar32;
  }
  else {
    uStack_478 = (psVar12->x).n[0];
    uStack_480 = (psVar12->x).n[1];
    uVar1 = (ng->x).n[0];
    psVar20 = (secp256k1_gej *)(extraout_RDX_02->x).n[0];
    psVar30 = (secp256k1_gej *)(uVar1 * uStack_478);
    lVar17 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_478),8);
    uVar21 = (long)psVar20 * uStack_480;
    psVar29 = SUB168(SEXT816((long)psVar20) * SEXT816((long)uStack_480),8);
    psVar31 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar16 = (ulong)((secp256k1_gej *)~uVar21 < psVar30);
    lVar18 = (0x7fffffffffffffff - (long)psVar29) - lVar17;
    psVar28 = extraout_RDX_02;
    psVar25 = (secp256k1_gej *)~uVar21;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar29,lVar17) != SBORROW8(lVar18,uVar16)) ==
        (long)(lVar18 - uVar16) < 0 || (long)psVar29 < 0) {
      uStack_488 = (psVar12->x).n[2];
      psVar25 = (secp256k1_gej *)(psVar12->x).n[3];
      puVar23 = (uint64_t *)((long)(psVar30->x).n + uVar21);
      psVar29 = (secp256k1_gej *)
                ((long)(psVar29->x).n + (ulong)CARRY8(uVar21,(ulong)psVar30) + lVar17);
      uVar21 = uVar1 * uStack_488;
      psVar30 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_488),8);
      auVar3 = SEXT816((long)psVar20);
      psVar20 = (secp256k1_gej *)((long)psVar20 * (long)psVar25);
      lVar17 = SUB168(auVar3 * SEXT816((long)psVar25),8);
      uVar16 = (ulong)(-(long)psVar20 - 1U < uVar21);
      lVar18 = (0x7fffffffffffffff - lVar17) - (long)psVar30;
      bVar9 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)psVar30) != SBORROW8(lVar18,uVar16)) !=
              (long)(lVar18 - uVar16) < 0 && -1 < lVar17;
      psVar12 = (secp256k1_gej *)CONCAT71((int7)(-(long)psVar20 - 1U >> 8),bVar9);
      psStack_490 = psVar25;
      if (bVar9) goto LAB_0011eb91;
      bVar9 = CARRY8((ulong)psVar20,uVar21);
      psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + uVar21);
      lVar18 = (long)(psVar30->x).n + (ulong)bVar9 + lVar17;
      psVar32 = psVar25;
      if (((ulong)puVar23 & 0x3fffffffffffffff) != 0) goto LAB_0011eb78;
      psVar26 = psVar30;
      if (((ulong)psVar20 & 0x3fffffffffffffff) != 0) goto LAB_0011eb7d;
      psVar20 = (secp256k1_gej *)((ulong)psVar20 >> 0x3e | lVar18 * 4);
      uVar16 = (ulong)puVar23 >> 0x3e | (long)psVar29 * 4;
      psVar26 = (secp256k1_gej *)(lVar18 >> 0x3e);
      psVar29 = (secp256k1_gej *)((long)psVar29 >> 0x3e);
      iStack_494 = iVar6;
      if (iVar6 != 1) {
        psVar27 = (secp256k1_gej *)0x3fffffffffffffff;
        r_00 = (secp256k1_gej *)((ulong)r_00 & 0xffffffff);
        psVar12 = (secp256k1_gej *)0x1;
        do {
          psVar30 = (secp256k1_gej *)(ng->x).n[(long)psVar12];
          psVar32 = (secp256k1_gej *)((long)psVar30 * uStack_478 + uVar16);
          puVar7 = (undefined1 *)
                   ((long)(psVar29->x).n +
                   (ulong)CARRY8((long)psVar30 * uStack_478,uVar16) +
                   SUB168(SEXT816((long)psVar30) * SEXT816((long)uStack_478),8));
          uVar1 = (extraout_RDX_02->x).n[(long)psVar12];
          uVar16 = uVar1 * uStack_480;
          lVar18 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_480),8);
          if (lVar18 < 0) {
            psVar31 = (secp256k1_gej *)((-0x8000000000000000 - lVar18) - (ulong)(uVar16 != 0));
            psVar29 = (secp256k1_gej *)
                      (((long)puVar7 - (long)psVar31) - (ulong)(psVar32 < (secp256k1_gej *)-uVar16))
            ;
            if ((SBORROW8((long)puVar7,(long)psVar31) !=
                SBORROW8((long)puVar7 - (long)psVar31,(ulong)(psVar32 < (secp256k1_gej *)-uVar16)))
                == (long)psVar29 < 0) goto LAB_0011ea62;
LAB_0011eb69:
            psStack_4a0 = (secp256k1_gej *)0x11eb6e;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011eb6e:
            psStack_4a0 = (secp256k1_gej *)0x11eb73;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011eb73;
          }
          psVar29 = (secp256k1_gej *)(-1 - uVar16);
          lVar17 = (0x7fffffffffffffff - lVar18) - (long)puVar7;
          psVar31 = (secp256k1_gej *)(lVar17 - (ulong)(psVar29 < psVar32));
          if ((SBORROW8(0x7fffffffffffffff - lVar18,(long)puVar7) !=
              SBORROW8(lVar17,(ulong)(psVar29 < psVar32))) != (long)psVar31 < 0) goto LAB_0011eb69;
LAB_0011ea62:
          bVar9 = CARRY8((ulong)psVar32,uVar16);
          psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + uVar16);
          psVar29 = (secp256k1_gej *)((long)(psVar20->x).n + (long)psVar30 * uStack_488);
          psVar30 = (secp256k1_gej *)
                    ((long)(psVar26->x).n +
                    (ulong)CARRY8((long)psVar30 * uStack_488,(ulong)psVar20) +
                    SUB168(SEXT816((long)psVar30) * SEXT816((long)uStack_488),8));
          uVar16 = uVar1 * (long)psVar25;
          lVar17 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar25),8);
          if (lVar17 < 0) {
            lVar24 = (-0x8000000000000000 - lVar17) - (ulong)(uVar16 != 0);
            lVar2 = (long)psVar30 - lVar24;
            psVar20 = (secp256k1_gej *)(lVar2 - (ulong)(psVar29 < (secp256k1_gej *)-uVar16));
            psVar31 = (secp256k1_gej *)0x7fffffffffffffff;
            if ((SBORROW8((long)psVar30,lVar24) !=
                SBORROW8(lVar2,(ulong)(psVar29 < (secp256k1_gej *)-uVar16))) != (long)psVar20 < 0)
            goto LAB_0011eb6e;
          }
          else {
            psVar20 = (secp256k1_gej *)(-1 - uVar16);
            psVar31 = (secp256k1_gej *)0x7fffffffffffffff;
            lVar2 = (0x7fffffffffffffff - lVar17) - (long)psVar30;
            if ((SBORROW8(0x7fffffffffffffff - lVar17,(long)psVar30) !=
                SBORROW8(lVar2,(ulong)(psVar20 < psVar29))) !=
                (long)(lVar2 - (ulong)(psVar20 < psVar29)) < 0) goto LAB_0011eb6e;
          }
          puVar23 = (uint64_t *)((long)(psVar29->x).n + uVar16);
          lVar17 = (long)(psVar30->x).n + (ulong)CARRY8((ulong)psVar29,uVar16) + lVar17;
          uVar16 = (long)(puVar7 + (ulong)bVar9 + lVar18) * 4 | (ulong)psVar32 >> 0x3e;
          (ng->x).n[(long)&psVar12[-1].field_0x97] = (uint64_t)((ulong)psVar32 & 0x3fffffffffffffff)
          ;
          psVar20 = (secp256k1_gej *)(lVar17 * 4 | (ulong)puVar23 >> 0x3e);
          (extraout_RDX_02->x).n[(long)&psVar12[-1].field_0x97] =
               (ulong)puVar23 & 0x3fffffffffffffff;
          psVar12 = (secp256k1_gej *)((long)(psVar12->x).n + 1);
          psVar26 = (secp256k1_gej *)(lVar17 >> 0x3e);
          psVar29 = (secp256k1_gej *)((long)(puVar7 + (ulong)bVar9 + lVar18) >> 0x3e);
          psVar32 = (secp256k1_gej *)((ulong)psVar32 & 0x3fffffffffffffff);
        } while (r_00 != psVar12);
      }
      psVar31 = (secp256k1_gej *)0x7fffffffffffffff;
      if ((undefined1 *)((long)(psVar29->x).n + ((ulong)(0x7fffffffffffffff < uVar16) - 1)) !=
          (undefined1 *)0xffffffffffffffff) goto LAB_0011eb82;
      psVar12 = (secp256k1_gej *)0xffffffffffffffff;
      (ng->x).n[(long)iVar6 + -1] = uVar16;
      psVar26 = (secp256k1_gej *)
                ((long)(psVar26->x).n + ((ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar20) - 1)
                );
      if (psVar26 == (secp256k1_gej *)0xffffffffffffffff) {
        (extraout_RDX_02->x).n[(long)iVar6 + -1] = (uint64_t)psVar20;
        return;
      }
      goto LAB_0011eb87;
    }
  }
  psStack_4a0 = (secp256k1_gej *)0x11eb91;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011eb91:
  psStack_4a0 = (secp256k1_gej *)secp256k1_ecmult_multi_simple_var;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psStack_4c8 = psVar29;
  psStack_4c0 = psVar28;
  psStack_4b8 = psVar31;
  psStack_4b0 = psVar30;
  psStack_4a8 = psVar25;
  psStack_4a0 = psVar27;
  secp256k1_gej_set_infinity(r_00);
  secp256k1_gej_set_infinity(&sStack_c48);
  sStack_ce0.x.n[0] = (uint64_t)asStack_bb0;
  sStack_ce0.x.n[1] = (uint64_t)asStack_a80;
  sStack_ce0.x.n[2] = (uint64_t)&sStack_8e0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_ce0,r_00,1,&sStack_c48,&secp256k1_scalar_zero,
             (secp256k1_scalar *)ng);
  if (psVar20 != (secp256k1_gej *)0x0) {
    psVar29 = (secp256k1_gej *)0x0;
    do {
      iVar6 = (*extraout_RDX_03)(&sStack_cfc,&sStack_ae8,psVar29,psVar12);
      if (iVar6 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_ce0,&sStack_ae8);
      sStack_cf8.aux = asStack_bb0;
      sStack_cf8.pre_a = asStack_a80;
      sStack_cf8.ps = &sStack_8e0;
      psVar30 = &sStack_ce0;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_cf8,&sStack_c48,1,&sStack_ce0,&sStack_cfc,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r_00,r_00,&sStack_c48,&psVar30->x);
      psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + 1);
    } while (psVar20 != psVar29);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* Operations: 9 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    SECP256K1_FE_VERIFY(bzinv);

    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        SECP256K1_GEJ_VERIFY(r);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}